

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctive.cpp
# Opt level: O0

bool __thiscall DisjunctiveEF::propagate(DisjunctiveEF *this)

{
  bool bVar1;
  ulong uVar2;
  int *in_RDI;
  DisjunctiveEF *in_stack_000000b8;
  int *in_stack_ffffffffffffffd0;
  int *__last;
  SortEstAsc in_stack_ffffffffffffffe0;
  
  *(undefined1 *)((long)in_RDI + 0x12) = 0;
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 6));
  std::sort<int*,DisjunctiveEF::SortEstAsc>
            (in_RDI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffe0);
  __last = *(int **)(in_RDI + 0x1e);
  vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 6));
  std::sort<int*,DisjunctiveEF::SortLetDsc>(in_RDI,__last,*(DisjunctiveEF **)(in_RDI + 0x26));
  if (((so.disj_edge_find & 1U) != 0) && (bVar1 = doEdgeFinding(in_stack_000000b8), !bVar1)) {
    return false;
  }
  if (((so.disj_set_bp & 1U) != 0) &&
     (uVar2 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(), (uVar2 & 1) == 0)) {
    return false;
  }
  return true;
}

Assistant:

bool propagate() override {
		trailed_pinfo_sz = false;

		// sort vars based on est and let
		std::sort(ests, ests + x.size(), sort_est_asc);
		std::sort(lets, lets + x.size(), sort_let_dsc);

		//		if (!findBasicPrecedences()) return false;
		if (so.disj_edge_find && !doEdgeFinding()) {
			return false;
		}
		if (so.disj_set_bp && !bp->propagate()) {
			return false;
		}

		return true;
	}